

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# token_evaluator.hpp
# Opt level: O0

value_type __thiscall
jsoncons::jsonpath::detail::
contains_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
::evaluate(contains_function<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
           *this,vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                 *args,error_code *ec)

{
  basic_string_view<char,_std::char_traits<char>_> __str;
  json_type jVar1;
  bool bVar2;
  type_conflict9 tVar3;
  size_type sVar4;
  unsigned_long *puVar5;
  const_reference pvVar6;
  size_type sVar7;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *this_00;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *in_RDX;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 uVar8;
  function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
  *in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *in_RDI;
  optional<unsigned_long> oVar9;
  type tVar10;
  value_type vVar11;
  type sv1;
  type sv0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *j;
  iterator __end0;
  iterator __begin0;
  array_range_type *__range4;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg1;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> arg0;
  undefined6 in_stack_fffffffffffffec8;
  semantic_tag in_stack_fffffffffffffece;
  undefined1 in_stack_fffffffffffffecf;
  basic_string_view<char,_std::char_traits<char>_> *in_stack_fffffffffffffed0;
  undefined4 in_stack_fffffffffffffed8;
  jsonpath_errc in_stack_fffffffffffffedc;
  error_code *in_stack_fffffffffffffee0;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
  *in_stack_fffffffffffffee8;
  __normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  local_80;
  array_range_type local_78;
  range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
  *local_68;
  _Storage<unsigned_long,_true> local_30;
  undefined1 local_28;
  vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
  *local_18;
  
  local_18 = in_RDX;
  sVar4 = std::
          vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
          ::size(in_RDX);
  oVar9 = function_base<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
          ::arity(in_RSI);
  local_30._M_value =
       oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
       super__Optional_payload_base<unsigned_long>._M_payload;
  local_28 = oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
             super__Optional_payload_base<unsigned_long>._M_engaged;
  puVar5 = std::optional<unsigned_long>::operator*((optional<unsigned_long> *)0x6d1239);
  if (sVar4 == *puVar5) {
    pvVar6 = std::
             vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ::operator[](local_18,0);
    parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::value(pvVar6);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffed0,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
    pvVar6 = std::
             vector<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>,_std::allocator<jsoncons::jsonpath::parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
             ::operator[](local_18,1);
    parameter<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>
    ::value(pvVar6);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffed0,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
    jVar1 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::type
                      ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *
                       )CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8));
    if (jVar1 == string_value) {
      bVar2 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::is_string
                        (in_stack_fffffffffffffee8);
      if (bVar2) {
        basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
        as<std::basic_string_view<char,std::char_traits<char>>>
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   0x6d149a);
        tVar10 = basic_json<char,jsoncons::order_preserving_policy,std::allocator<char>>::
                 as<std::basic_string_view<char,std::char_traits<char>>>
                           ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                             *)0x6d14cd);
        __str._M_str = (char *)tVar10._M_len;
        __str._M_len = (size_t)tVar10._M_str;
        sVar7 = std::basic_string_view<char,_std::char_traits<char>_>::find
                          (in_stack_fffffffffffffed0,__str,
                           CONCAT17(in_stack_fffffffffffffecf,
                                    CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
        if (sVar7 == 0xffffffffffffffff) {
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf,
                     in_stack_fffffffffffffece);
        }
        else {
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf,
                     in_stack_fffffffffffffece);
        }
      }
      else {
        std::error_code::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
        basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                  ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   in_stack_fffffffffffffed0,
                   (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                   CONCAT17(in_stack_fffffffffffffecf,
                            CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
      }
    }
    else if (jVar1 == array_value) {
      local_78 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::
                 array_range(in_RDI);
      local_68 = &local_78;
      local_80._M_current =
           (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
           range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
           ::begin(local_68);
      range<__gnu_cxx::__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>,___gnu_cxx::__normal_iterator<const_jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>_>
      ::end(local_68);
      while( true ) {
        bVar2 = __gnu_cxx::operator!=
                          ((__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffffed0,
                           (__normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
                            *)CONCAT17(in_stack_fffffffffffffecf,
                                       CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)
                                      ));
        if (!bVar2) break;
        __gnu_cxx::
        __normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
        ::operator*(&local_80);
        tVar3 = jsoncons::operator==
                          ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)in_stack_fffffffffffffed0,
                           (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                            *)CONCAT17(in_stack_fffffffffffffecf,
                                       CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)
                                      ));
        if (tVar3) {
          basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                    ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                     in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf,
                     in_stack_fffffffffffffece);
          goto LAB_006d159c;
        }
        __gnu_cxx::
        __normal_iterator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_*,_std::vector<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>_>_>_>
        ::operator++(&local_80);
      }
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
                 in_stack_fffffffffffffed0,(bool)in_stack_fffffffffffffecf,in_stack_fffffffffffffece
                );
    }
    else {
      std::error_code::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
      this_00 = basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
      basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
                (this_00,(basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>
                          *)CONCAT17(in_stack_fffffffffffffecf,
                                     CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)))
      ;
    }
LAB_006d159c:
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               0x6d15a9);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::~basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               0x6d15b6);
    uVar8 = extraout_RDX_00;
  }
  else {
    std::error_code::operator=(in_stack_fffffffffffffee0,in_stack_fffffffffffffedc);
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::null();
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::basic_json
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               in_stack_fffffffffffffed0,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               CONCAT17(in_stack_fffffffffffffecf,
                        CONCAT16(in_stack_fffffffffffffece,in_stack_fffffffffffffec8)));
    uVar8 = extraout_RDX;
  }
  vVar11.field_0.int64_.val_ = uVar8;
  vVar11.field_0._0_8_ = in_RDI;
  return (value_type)vVar11.field_0;
}

Assistant:

value_type evaluate(const std::vector<parameter_type>& args, 
            std::error_code& ec) const override
        {
            if (args.size() != *this->arity())
            {
                ec = jsonpath_errc::invalid_arity;
                return value_type::null();
            }

            auto arg0= args[0].value();
            auto arg1= args[1].value();

            switch (arg0.type())
            {
                case json_type::array_value:
                    for (auto& j : arg0.array_range())
                    {
                        if (j == arg1)
                        {
                            return value_type(true, semantic_tag::none);
                        }
                    }
                    return value_type(false, semantic_tag::none);
                case json_type::string_value:
                {
                    if (!arg1.is_string())
                    {
                        ec = jsonpath_errc::invalid_type;
                        return value_type::null();
                    }
                    auto sv0 = arg0.template as<string_view_type>();
                    auto sv1 = arg1.template as<string_view_type>();
                    return sv0.find(sv1) != string_view_type::npos ? value_type(true, semantic_tag::none) : value_type(false, semantic_tag::none);
                }
                default:
                {
                    ec = jsonpath_errc::invalid_type;
                    return value_type::null();
                }
            }
        }